

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionGlobalSinkState::CombineLocalPartition
          (PartitionGlobalSinkState *this,GroupingPartition *param_1,GroupingAppend *param_2)

{
  pointer this_00;
  type state;
  pointer this_01;
  type other;
  
  if ((param_1->
      super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
      .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl !=
      (PartitionedTupleData *)0x0) {
    this_00 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              ::operator->(param_1);
    state = unique_ptr<duckdb::PartitionedTupleDataAppendState,_std::default_delete<duckdb::PartitionedTupleDataAppendState>,_true>
            ::operator*(param_2);
    PartitionedTupleData::FlushAppendState(this_00,state);
    ::std::mutex::lock(&this->lock);
    SyncLocalPartition(this,param_1,param_2);
    this_01 = unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
              ::operator->(&this->grouping_data);
    other = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator*(param_1);
    PartitionedTupleData::Combine(&this_01->super_PartitionedTupleData,other);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  return;
}

Assistant:

void PartitionLocalMergeState::Prepare() {
	merge_state->group_data.reset();

	auto &global_sort = *merge_state->global_sort;
	global_sort.PrepareMergePhase();
}